

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

bool __thiscall QFileSystemModel::isDir(QFileSystemModel *this,QModelIndex *index)

{
  bool bVar1;
  byte bVar2;
  QFileSystemModelPrivate *index_00;
  QFileSystemNode *this_00;
  QFileSystemModel *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QFileSystemNode *n;
  QFileSystemModelPrivate *d;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  QFileSystemModelPrivate *in_stack_ffffffffffffffc8;
  bool local_11;
  QFileInfo local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  index_00 = d_func((QFileSystemModel *)0xaa492f);
  bVar1 = QModelIndex::isValid(in_RDI);
  if (bVar1) {
    this_00 = QFileSystemModelPrivate::node(in_stack_ffffffffffffffc8,in_RDI);
    bVar1 = QFileSystemModelPrivate::QFileSystemNode::hasInformation(this_00);
    if (bVar1) {
      local_11 = QFileSystemModelPrivate::QFileSystemNode::isDir
                           ((QFileSystemNode *)
                            CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    }
    else {
      fileInfo(in_RSI,(QModelIndex *)index_00);
      bVar2 = QFileInfo::isDir();
      local_11 = (bool)(bVar2 & 1);
      QFileInfo::~QFileInfo(local_10);
    }
  }
  else {
    local_11 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemModel::isDir(const QModelIndex &index) const
{
    // This function is for public usage only because it could create a file info
    Q_D(const QFileSystemModel);
    if (!index.isValid())
        return true;
    QFileSystemModelPrivate::QFileSystemNode *n = d->node(index);
    if (n->hasInformation())
        return n->isDir();
    return fileInfo(index).isDir();
}